

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O3

int ssl_get_with_curl(char *url,curlmembuf *buffer,char *username,char *password)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  size_t sVar7;
  byte *pbVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float version;
  char curlErrBuf [256];
  char errStr [1200];
  char agentStr [1200];
  float local_aac;
  char *local_aa8;
  char *local_aa0;
  char local_a98 [256];
  char local_998 [1200];
  char local_4e8 [1208];
  
  local_aac = 0.0;
  local_aa0 = username;
  pcVar4 = strstr(url,"ftp://");
  pcVar5 = strstr(url,".gz");
  if ((pcVar5 == (char *)0x0) && (pcVar5 = strstr(url,".Z"), pcVar5 == (char *)0x0)) {
    pcVar5 = strchr(url,0x3f);
    bVar10 = pcVar5 == (char *)0x0;
  }
  else {
    bVar10 = false;
  }
  pcVar5 = strstr(url,".Z");
  if (pcVar5 != (char *)0x0 && pcVar4 == (char *)0x0) {
    pcVar4 = "x-compress .Z format not currently supported with curl https transfers";
LAB_00139228:
    ffpmsg(pcVar4);
    return 0x68;
  }
  local_aa8 = password;
  uVar6 = curl_easy_init();
  iVar2 = curl_easy_setopt(uVar6,0x40,1);
  if (iVar2 != 0) {
    ffpmsg("ERROR: CFITSIO was built with a libcurl library that ");
    pcVar4 = "does not have SSL support, and therefore can\'t perform https or ftps transfers.";
    goto LAB_00139228;
  }
  curl_easy_setopt(uVar6,0x51,2);
  curl_easy_setopt(uVar6,0x29,curl_verbose);
  curl_easy_setopt(uVar6,0x4e2b,curlToMemCallback);
  fVar11 = ffvers(&local_aac);
  snprintf(local_4e8,0x4b0,"FITSIO/HEASARC/%-8.4f",SUB84((double)fVar11,0));
  curl_easy_setopt(uVar6,0x2722,local_4e8);
  buffer->memory = (char *)0x0;
  buffer->size = 0;
  curl_easy_setopt(uVar6,0x2711,buffer);
  curl_easy_setopt(uVar6,0x271a,local_a98);
  local_a98[0] = '\0';
  curl_easy_setopt(uVar6,0x2d,1);
  curl_easy_setopt(uVar6,0x2776,"");
  sVar7 = strlen(url);
  pcVar5 = (char *)malloc(sVar7 + 4);
  strcpy(pcVar5,url);
  bVar9 = show_fits_download_progress != '\x01';
  if (!bVar9) {
    curl_easy_setopt(uVar6,0x4e58,curlProgressCallback);
    curl_easy_setopt(uVar6,0x2749,pcVar5);
  }
  curl_easy_setopt(uVar6,0x2b,bVar9);
  pcVar1 = local_aa8;
  if (pcVar4 != (char *)0x0) {
    curl_easy_setopt(uVar6,0x77,3);
    if (local_aa0 != (char *)0x0) {
      curl_easy_setopt(uVar6,0x27bd);
    }
    if (pcVar1 != (char *)0x0) {
      curl_easy_setopt(uVar6,0x27be,pcVar1);
    }
  }
  if (bVar10) {
    sVar7 = strlen(pcVar5);
    builtin_strncpy(pcVar5 + sVar7,".gz",4);
  }
  curl_easy_setopt(uVar6,0x2712,pcVar5);
  uVar3 = curl_easy_perform(uVar6);
  if (uVar3 == 0) goto LAB_001394a7;
  if ((uVar3 == 0x16) || (uVar3 == 0x4e)) {
    if (bVar10) {
      if (pcVar4 != (char *)0x0) {
        strcpy(pcVar5,url);
        sVar7 = strlen(pcVar5);
        (pcVar5 + sVar7)[0] = '.';
        (pcVar5 + sVar7)[1] = 'Z';
        pcVar5[sVar7 + 2] = '\0';
        curl_easy_setopt(uVar6,0x2712,pcVar5);
        iVar2 = curl_easy_perform(uVar6);
        if (iVar2 == 0) goto LAB_001394a7;
      }
      strcpy(pcVar5,url);
      curl_easy_setopt(uVar6,0x2712,pcVar5);
      uVar3 = curl_easy_perform(uVar6);
      if (uVar3 == 0) goto LAB_001394a7;
    }
    goto LAB_001395e4;
  }
  pbVar8 = (byte *)getenv("CFITSIO_VERIFY_HTTPS");
  if ((pbVar8 != (byte *)0x0) && ((*pbVar8 | 0x20) == 0x74)) goto LAB_001395e4;
  curl_easy_setopt(uVar6,0x40,0);
  curl_easy_setopt(uVar6,0x51,0);
  uVar3 = curl_easy_perform(uVar6);
  if (uVar3 != 0) {
    if ((bool)(pcVar4 != (char *)0x0 & bVar10)) {
      strcpy(pcVar5,url);
      sVar7 = strlen(pcVar5);
      (pcVar5 + sVar7)[0] = '.';
      (pcVar5 + sVar7)[1] = 'Z';
      pcVar5[sVar7 + 2] = '\0';
      curl_easy_setopt(uVar6,0x2712,pcVar5);
      uVar3 = curl_easy_perform(uVar6);
      if (uVar3 == 0) goto LAB_00139619;
    }
    if (!bVar10) {
LAB_001395e4:
      snprintf(local_998,0x4b0,"libcurl error: %d",(ulong)uVar3);
      ffpmsg(local_998);
      if (local_a98[0] != '\0') {
        ffpmsg(local_a98);
      }
      curl_easy_cleanup(uVar6);
      free(pcVar5);
      return 0x68;
    }
    strcpy(pcVar5,url);
    curl_easy_setopt(uVar6,0x2712,pcVar5);
    uVar3 = curl_easy_perform(uVar6);
    if (uVar3 != 0) goto LAB_001395e4;
  }
LAB_00139619:
  fprintf(_stderr,"Warning: Unable to perform SSL verification on https transfer from: %s\n",pcVar5)
  ;
LAB_001394a7:
  strcpy(url,pcVar5);
  free(pcVar5);
  curl_easy_cleanup(uVar6);
  return 0;
}

Assistant:

int ssl_get_with_curl(char *url, curlmembuf* buffer, char* username,
                        char* password)
{
  /* These settings will force libcurl to perform host and peer authentication.
     If it fails, this routine will try again without authentication (unless
     user forbids this via CFITSIO_VERIFY_HTTPS environment variable).
  */
  long verifyPeer = 1;
  long verifyHost = 2;
  char errStr[MAXLEN];
  char agentStr[MAXLEN];
  float version=0.0;
  char *tmpUrl=0;
  char *verify=0;
  int isFtp = (strstr(url,"ftp://") != NULL);
  int experimentWithCompression = (!strstr(url,".gz") && !strstr(url,".Z")
                && !strstr(url,"?"));
  int notFound=1;
  #ifdef CFITSIO_HAVE_CURL
  CURL *curl=0;
  CURLcode res;
  char curlErrBuf[CURL_ERROR_SIZE];
  
  if (strstr(url,".Z") && !isFtp)
  {
     ffpmsg("x-compress .Z format not currently supported with curl https transfers");
     return(FILE_NOT_OPENED);
  }

  /* Will ASSUME curl_global_init has been called by this point.
     It is not thread-safe to call it here. */
  curl = curl_easy_init();
   
  res = curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, verifyPeer);
  if (res != CURLE_OK)
  {
     ffpmsg("ERROR: CFITSIO was built with a libcurl library that ");
     ffpmsg("does not have SSL support, and therefore can't perform https or ftps transfers.");
     return (FILE_NOT_OPENED);    
  }
  curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, verifyHost);
  
  curl_easy_setopt(curl, CURLOPT_VERBOSE, (long)curl_verbose);
  curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, curlToMemCallback);
  snprintf(agentStr,MAXLEN,"FITSIO/HEASARC/%-8.4f",ffvers(&version)); 
  curl_easy_setopt(curl, CURLOPT_USERAGENT,agentStr);
  
  buffer->memory = 0; /* malloc/realloc will grow this in the callback function */
  buffer->size = 0;
  curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *)buffer);
  curl_easy_setopt(curl, CURLOPT_ERRORBUFFER, curlErrBuf);
  curlErrBuf[0]=0;
  /* This is needed for easy_perform to return an error whenever http server
      returns an error >= 400, ie. if it can't find the requested file. */
  curl_easy_setopt(curl, CURLOPT_FAILONERROR,  1L);
  /* This turns on automatic decompression for all recognized types. */
  curl_easy_setopt(curl, CURLOPT_ENCODING, "");
  
  /* tmpUrl should be large enough to accomodate original url + ".gz" */
  tmpUrl = (char *)malloc(strlen(url)+4);
  strcpy(tmpUrl, url);
  if (show_fits_download_progress)
  {
     curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION, curlProgressCallback);
     curl_easy_setopt(curl, CURLOPT_PROGRESSDATA, tmpUrl);
     curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0L);
  }
  else
     curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 1L);
  
  /* USESSL only necessary for ftps, though it may not hurt anything
     if it were also set for https. */
  if (isFtp)
  {
     curl_easy_setopt(curl, CURLOPT_USE_SSL, CURLUSESSL_ALL);
     if (username)
        curl_easy_setopt(curl, CURLOPT_USERNAME, username);
     if (password)
        curl_easy_setopt(curl, CURLOPT_PASSWORD, password);
  }
  
  /* Unless url already contains a .gz, .Z or '?' (probably from a cgi script),
     first try with .gz appended. */
  
  if (experimentWithCompression)
     strcat(tmpUrl, ".gz");

  /* First attempt: verification on */
  curl_easy_setopt(curl, CURLOPT_URL, tmpUrl);
  res = curl_easy_perform(curl);
  if (res != CURLE_OK && res != CURLE_HTTP_RETURNED_ERROR && 
                res != CURLE_REMOTE_FILE_NOT_FOUND)
  {
     /*   CURLE_HTTP_RETURNED_ERROR is what gets returned if HTTP server
        returns an error code >= 400. CURLE_REMOTE_FILE_NOT_FOUND may
        be returned by an ftp server. If these are not causing this error, 
        assume it is a verification issue. 
          Try again with verification removed, unless user disallowed it
        via environment variable. */
     verify = getenv("CFITSIO_VERIFY_HTTPS");
     if (verify)
     {
        if (verify[0] == 'T' || verify[0] == 't')
        {
           snprintf(errStr,MAXLEN,"libcurl error: %d",res);
           ffpmsg(errStr);
           if (strlen(curlErrBuf))
              ffpmsg(curlErrBuf);     
           curl_easy_cleanup(curl);  
           free(tmpUrl);
           return (FILE_NOT_OPENED);
        }
     }
     verifyPeer = 0;
     verifyHost = 0;
     curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, verifyPeer);
     curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, verifyHost);
     /* Second attempt: no verification, .gz appended */
     res = curl_easy_perform(curl);
     if (res != CURLE_OK)
     {
        if (isFtp && experimentWithCompression)
        {
           strcpy(tmpUrl, url);
           strcat(tmpUrl, ".Z");
           curl_easy_setopt(curl, CURLOPT_URL, tmpUrl);
           /* For ftps, make another attempt with .Z */
           res = curl_easy_perform(curl);
           if (res == CURLE_OK)
           {
              /* Success, but should still warn */
              fprintf(stderr, "Warning: Unable to perform SSL verification on https transfer from: %s\n",
                   tmpUrl);
              notFound=0;          
           }
        }
          
        /* If we've been appending .gz or .Z, try a final time without. */
        if (experimentWithCompression && notFound)
        {
           strcpy(tmpUrl, url);
           curl_easy_setopt(curl, CURLOPT_URL, tmpUrl);
           /* attempt with no verification, no .gz or .Z appended */ 
           res = curl_easy_perform(curl);
           if (res != CURLE_OK)
           {
              snprintf(errStr,MAXLEN,"libcurl error: %d",res);
              ffpmsg(errStr);
              if (strlen(curlErrBuf))
                 ffpmsg(curlErrBuf);     
              curl_easy_cleanup(curl);  
              free(tmpUrl);
              return (FILE_NOT_OPENED);
           }
           else
              /* Success, but should still warn */
              fprintf(stderr, "Warning: Unable to perform SSL verification on https transfer from: %s\n",
                   tmpUrl);           
        }
        else if (notFound)
        {
           snprintf(errStr,MAXLEN,"libcurl error: %d",res);
           ffpmsg(errStr);
           if (strlen(curlErrBuf))
              ffpmsg(curlErrBuf);     
           curl_easy_cleanup(curl);  
           free(tmpUrl);
           return (FILE_NOT_OPENED);
        }        
     }
     else
        /* Success, but still issue warning */
        fprintf(stderr, "Warning: Unable to perform SSL verification on https transfer from: %s\n",
             tmpUrl);

  }
  else if (res == CURLE_HTTP_RETURNED_ERROR || res == CURLE_REMOTE_FILE_NOT_FOUND)
  {
     /* .gz extension failed and verification isn't the problem.  
         No need to relax peer/host checking */
     /* Unless url already contained a .gz, .Z or '?' (probably from a cgi script),
        try again with original url unappended (but first try .Z if this is ftps). */
     if (experimentWithCompression)
     {
        if (isFtp)
        {
           strcpy(tmpUrl, url);
           strcat(tmpUrl, ".Z");
           curl_easy_setopt(curl, CURLOPT_URL, tmpUrl); 
           res = curl_easy_perform(curl);
           if (res == CURLE_OK)
              notFound = 0;
        }
        if (notFound)
        {
           strcpy(tmpUrl, url);
           curl_easy_setopt(curl, CURLOPT_URL, tmpUrl); 
           res = curl_easy_perform(curl);
           if (res != CURLE_OK)
           {
              snprintf(errStr,MAXLEN,"libcurl error: %d",res);
              ffpmsg(errStr);
              if (strlen(curlErrBuf))
                 ffpmsg(curlErrBuf);     
              curl_easy_cleanup(curl);  
              free(tmpUrl);
              return (FILE_NOT_OPENED);
           }
        }
     }
     else
     {
        snprintf(errStr,MAXLEN,"libcurl error: %d",res);
        ffpmsg(errStr);
        if (strlen(curlErrBuf))
           ffpmsg(curlErrBuf);     
        curl_easy_cleanup(curl);  
        free(tmpUrl);
        return (FILE_NOT_OPENED);
     }
  }
  
  /* If we made it here, assume tmpUrl was successful. Calling routines
     must make sure url can hold up to 3 extra chars */
  strcpy(url, tmpUrl);
  
  free(tmpUrl);
  curl_easy_cleanup(curl);
  
  #else
   ffpmsg("ERROR: This CFITSIO build was not compiled with the libcurl library package ");
   ffpmsg("and therefore it cannot perform HTTPS or FTPS connections."); 
   return (FILE_NOT_OPENED);  
  
  #endif
  return 0;
}